

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O0

void __thiscall zmq::session_base_t::pipe_terminated(session_base_t *this,pipe_t *pipe_)

{
  long lVar1;
  own_t *poVar2;
  bool bVar3;
  size_type sVar4;
  own_t *in_RSI;
  own_t *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar5;
  
  uVar5 = true;
  if ((in_RSI != (own_t *)in_RDI[1].options.affinity) &&
     (uVar5 = true, in_RSI != *(own_t **)&in_RDI[1].options.routing_id_size)) {
    sVar4 = std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::count
                      ((set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>
                        *)in_RSI,(key_type *)in_RDI);
    uVar5 = sVar4 == 1;
  }
  if (((uVar5 ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "pipe_ == _pipe || pipe_ == _zap_pipe || _terminating_pipes.count (pipe_) == 1",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/session_base.cpp"
            ,0x10e);
    fflush(_stderr);
    zmq_abort((char *)0x30303e);
  }
  if (in_RSI == (own_t *)in_RDI[1].options.affinity) {
    in_RDI[1].options.affinity = 0;
    if ((in_RDI[1].options.routing_id[0x57] & 1) != 0) {
      io_object_t::cancel_timer
                ((io_object_t *)CONCAT17(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
      ;
      in_RDI[1].options.routing_id[0x57] = '\0';
    }
  }
  else if (in_RSI == *(own_t **)&in_RDI[1].options.routing_id_size) {
    in_RDI[1].options.routing_id_size = '\0';
    in_RDI[1].options.routing_id[0] = '\0';
    in_RDI[1].options.routing_id[1] = '\0';
    in_RDI[1].options.routing_id[2] = '\0';
    in_RDI[1].options.routing_id[3] = '\0';
    in_RDI[1].options.routing_id[4] = '\0';
    in_RDI[1].options.routing_id[5] = '\0';
    in_RDI[1].options.routing_id[6] = '\0';
  }
  else {
    std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::erase
              ((set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *)
               CONCAT17(uVar5,in_stack_ffffffffffffffe0),
               (key_type *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  bVar3 = own_t::is_terminating(in_RDI);
  if ((!bVar3) && (((in_RDI->options).raw_socket & 1U) != 0)) {
    if (*(long *)(in_RDI[1].options.routing_id + 0x3f) != 0) {
      (**(code **)(**(long **)(in_RDI[1].options.routing_id + 0x3f) + 0x20))();
      poVar2 = in_RDI + 1;
      (poVar2->options).routing_id[0x3f] = '\0';
      (poVar2->options).routing_id[0x40] = '\0';
      (poVar2->options).routing_id[0x41] = '\0';
      (poVar2->options).routing_id[0x42] = '\0';
      (poVar2->options).routing_id[0x43] = '\0';
      (poVar2->options).routing_id[0x44] = '\0';
      (poVar2->options).routing_id[0x45] = '\0';
      (poVar2->options).routing_id[0x46] = '\0';
    }
    own_t::terminate((own_t *)CONCAT17(uVar5,in_stack_ffffffffffffffe0));
  }
  if (((((in_RDI[1].options.routing_id[0x38] & 1) != 0) && (in_RDI[1].options.affinity == 0)) &&
      (lVar1._0_1_ = in_RDI[1].options.routing_id_size,
      lVar1._1_1_ = in_RDI[1].options.routing_id[0], lVar1._2_1_ = in_RDI[1].options.routing_id[1],
      lVar1._3_1_ = in_RDI[1].options.routing_id[2], lVar1._4_1_ = in_RDI[1].options.routing_id[3],
      lVar1._5_1_ = in_RDI[1].options.routing_id[4], lVar1._6_1_ = in_RDI[1].options.routing_id[5],
      lVar1._7_1_ = in_RDI[1].options.routing_id[6], lVar1 == 0)) &&
     (bVar3 = std::set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_>::
              empty((set<zmq::pipe_t_*,_std::less<zmq::pipe_t_*>,_std::allocator<zmq::pipe_t_*>_> *)
                    0x303161), bVar3)) {
    in_RDI[1].options.routing_id[0x38] = '\0';
    own_t::process_term(in_RSI,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void zmq::session_base_t::pipe_terminated (pipe_t *pipe_)
{
    // Drop the reference to the deallocated pipe if required.
    zmq_assert (pipe_ == _pipe || pipe_ == _zap_pipe
                || _terminating_pipes.count (pipe_) == 1);

    if (pipe_ == _pipe) {
        // If this is our current pipe, remove it
        _pipe = NULL;
        if (_has_linger_timer) {
            cancel_timer (linger_timer_id);
            _has_linger_timer = false;
        }
    } else if (pipe_ == _zap_pipe)
        _zap_pipe = NULL;
    else
        // Remove the pipe from the detached pipes set
        _terminating_pipes.erase (pipe_);

    if (!is_terminating () && options.raw_socket) {
        if (_engine) {
            _engine->terminate ();
            _engine = NULL;
        }
        terminate ();
    }

    //  If we are waiting for pending messages to be sent, at this point
    //  we are sure that there will be no more messages and we can proceed
    //  with termination safely.
    if (_pending && !_pipe && !_zap_pipe && _terminating_pipes.empty ()) {
        _pending = false;
        own_t::process_term (0);
    }
}